

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O2

uint32_t memory_tree_ns::compute_hamming_loss_via_oas
                   (memory_tree *b,single_learner *base,uint32_t cn,example *ec,
                   v_array<unsigned_int> *selected_labs)

{
  label_t lVar1;
  wclass *pwVar2;
  wclass *pwVar3;
  size_t sVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  size_t sVar8;
  uint32_t uVar9;
  long lVar10;
  size_t i;
  ulong uVar11;
  labels preds;
  labels multilabels;
  v_array<unsigned_int> leaf_labs;
  v_array<unsigned_int> local_58;
  
  v_array<unsigned_int>::delete_v(selected_labs);
  local_58.end_array = (uint *)0x0;
  local_58.erase_count = 0;
  local_58._begin = (uint *)0x0;
  local_58._end = (uint *)0x0;
  collect_labels_from_leaf(b,cn,&local_58);
  lVar1 = (ec->l).multi;
  pwVar2 = (ec->l).cs.costs._end;
  pwVar3 = (ec->l).cs.costs.end_array;
  sVar4 = (ec->l).cs.costs.erase_count;
  pfVar5 = (ec->pred).scalars._begin;
  pfVar6 = (ec->pred).scalars._end;
  pfVar7 = (ec->pred).scalars.end_array;
  sVar8 = (ec->pred).scalars.erase_count;
  (ec->l).cs.costs._begin = (wclass *)0x3f8000007f7fffff;
  (ec->l).simple.initial = 0.0;
  lVar10 = 0;
  for (uVar11 = 0; uVar11 < (ulong)((long)local_58._end - (long)local_58._begin >> 2);
      uVar11 = uVar11 + 1) {
    LEARNER::learner<char,_example>::predict
              (base,ec,b->max_routers + (ulong)*(uint *)((long)local_58._begin + lVar10) + 1);
    if (0.0 < (ec->pred).scalar) {
      v_array<unsigned_int>::push_back(selected_labs,(uint *)((long)local_58._begin + lVar10));
    }
    lVar10 = lVar10 + 4;
  }
  (ec->pred).scalars.end_array = pfVar7;
  (ec->pred).scalars.erase_count = sVar8;
  (ec->pred).scalars._begin = pfVar5;
  (ec->pred).scalars._end = pfVar6;
  (ec->l).cs.costs.end_array = pwVar3;
  (ec->l).cs.costs.erase_count = sVar4;
  (ec->l).cs.costs._begin = (wclass *)lVar1;
  (ec->l).cs.costs._end = pwVar2;
  uVar9 = hamming_loss((v_array<unsigned_int> *)&(ec->l).simple,selected_labs);
  return uVar9;
}

Assistant:

inline uint32_t compute_hamming_loss_via_oas(memory_tree& b, single_learner& base, 
		    const uint32_t cn, example& ec, v_array<uint32_t>& selected_labs)
    {
	    selected_labs.delete_v();
    	v_array<uint32_t> leaf_labs = v_init<uint32_t>();
	    collect_labels_from_leaf(b, cn, leaf_labs); //unique labels stored in the leaf.
	    MULTILABEL::labels multilabels = ec.l.multilabels;
	    MULTILABEL::labels preds = ec.pred.multilabels;
	    ec.l.simple = {FLT_MAX, 1.f, 0.f};
	    for (size_t i = 0; i < leaf_labs.size(); i++){
		    base.predict(ec, b.max_routers + 1 + leaf_labs[i]);
		    float score = ec.pred.scalar;
		    if (score > 0)
			    selected_labs.push_back(leaf_labs[i]);
	    }
	    ec.pred.multilabels = preds;
	    ec.l.multilabels = multilabels;

	    return hamming_loss(ec.l.multilabels.label_v, selected_labs);
    }